

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O3

TIFFReadDirEntryErr TIFFReadDirEntrySshort(TIFF *tif,TIFFDirEntry *direntry,int16_t *value)

{
  uint32_t uVar1;
  TIFFReadDirEntryErr TVar2;
  uint uVar3;
  ulong uVar4;
  int32_t m;
  undefined8 local_20;
  
  if (direntry->tdir_count != 1) {
    return TIFFReadDirEntryErrCount;
  }
  TVar2 = TIFFReadDirEntryErrType;
  switch(direntry->tdir_type) {
  case 1:
    uVar3 = (uint)*(byte *)&direntry->tdir_offset;
    break;
  default:
    goto switchD_00294577_caseD_2;
  case 3:
    local_20._0_2_ = (direntry->tdir_offset).toff_short;
    if ((char)tif->tif_flags < '\0') {
      TIFFSwabShort((uint16_t *)&local_20);
    }
    TVar2 = (ushort)local_20 >> 0xd & TIFFReadDirEntryErrRange;
    if (((ushort)local_20 >> 0xd & 4) != 0) {
      return TVar2;
    }
    *value = (ushort)local_20;
    return TVar2;
  case 4:
    uVar3 = (direntry->tdir_offset).toff_long;
    local_20._0_2_ = (ushort)uVar3;
    local_20._2_2_ = (undefined2)(uVar3 >> 0x10);
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabLong((uint32_t *)&local_20);
      uVar3 = CONCAT22(local_20._2_2_,(ushort)local_20);
    }
    if (0x7fff < uVar3) {
      return TIFFReadDirEntryErrRange;
    }
    break;
  case 6:
    uVar3 = (uint)*(char *)&direntry->tdir_offset;
    break;
  case 8:
    uVar1 = tif->tif_flags;
    *value = (direntry->tdir_offset).toff_short;
    if (-1 < (char)uVar1) {
      return TIFFReadDirEntryErrOk;
    }
    TIFFSwabShort((uint16_t *)value);
    return TIFFReadDirEntryErrOk;
  case 9:
    uVar3 = (direntry->tdir_offset).toff_long;
    local_20._0_2_ = (ushort)uVar3;
    local_20._2_2_ = (undefined2)(uVar3 >> 0x10);
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabLong((uint32_t *)&local_20);
      uVar3 = CONCAT22(local_20._2_2_,(ushort)local_20);
    }
    if ((int)(short)uVar3 != uVar3) {
      return TIFFReadDirEntryErrRange;
    }
    break;
  case 0x10:
    TVar2 = TIFFReadDirEntryCheckedLong8(tif,direntry,&local_20);
    if (TVar2 != TIFFReadDirEntryErrOk) {
      return TVar2;
    }
    uVar4 = CONCAT44(local_20._4_4_,CONCAT22(local_20._2_2_,(ushort)local_20));
    if (0x7fff < uVar4) {
      return TIFFReadDirEntryErrRange;
    }
    goto LAB_00294631;
  case 0x11:
    TVar2 = TIFFReadDirEntryCheckedSlong8(tif,direntry,&local_20);
    if (TVar2 != TIFFReadDirEntryErrOk) {
      return TVar2;
    }
    uVar4 = CONCAT44(local_20._4_4_,CONCAT22(local_20._2_2_,(ushort)local_20));
    if ((long)(short)(ushort)local_20 != uVar4) {
      return TIFFReadDirEntryErrRange;
    }
LAB_00294631:
    *value = (int16_t)uVar4;
    goto LAB_00294668;
  }
  *value = (int16_t)uVar3;
LAB_00294668:
  TVar2 = TIFFReadDirEntryErrOk;
switchD_00294577_caseD_2:
  return TVar2;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntrySshort(TIFF *tif, TIFFDirEntry *direntry, int16_t *value)
{
    enum TIFFReadDirEntryErr err;
    if (direntry->tdir_count != 1)
        return (TIFFReadDirEntryErrCount);
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t m;
            TIFFReadDirEntryCheckedByte(tif, direntry, &m);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SBYTE:
        {
            int8_t m;
            TIFFReadDirEntryCheckedSbyte(tif, direntry, &m);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SHORT:
        {
            uint16_t m;
            TIFFReadDirEntryCheckedShort(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeSshortShort(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SSHORT:
            TIFFReadDirEntryCheckedSshort(tif, direntry, value);
            return (TIFFReadDirEntryErrOk);
        case TIFF_LONG:
        {
            uint32_t m;
            TIFFReadDirEntryCheckedLong(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeSshortLong(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG:
        {
            int32_t m;
            TIFFReadDirEntryCheckedSlong(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeSshortSlong(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_LONG8:
        {
            uint64_t m;
            err = TIFFReadDirEntryCheckedLong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeSshortLong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG8:
        {
            int64_t m;
            err = TIFFReadDirEntryCheckedSlong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeSshortSlong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        default:
            return (TIFFReadDirEntryErrType);
    }
}